

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  size_t sVar9;
  FILE *__stream;
  byte *__s;
  byte *__s_00;
  byte *pbVar10;
  byte *pbVar11;
  undefined8 uVar12;
  byte *pbVar13;
  char *pcVar14;
  command_info *cmdinfo;
  char *pcVar15;
  char envr [256];
  byte local_238 [520];
  
  putchar(10);
  iVar4 = PHYSFS_init(*argv);
  if (iVar4 == 0) {
    uVar12 = PHYSFS_getLastError();
    printf("PHYSFS_init() failed!\n  reason: %s.\n",uVar12);
    return 1;
  }
  PHYSFS_getLinkedVersion(local_238);
  iVar4 = 1;
  printf("test_physfs version %d.%d.%d.\n Compiled against PhysicsFS version %d.%d.%d,\n and linked against %d.%d.%d.\n\n"
         ,3,0,1,3,0,1,(ulong)local_238[0],(ulong)local_238[1],(ulong)local_238[2]);
  plVar7 = (long *)PHYSFS_supportedArchiveTypes();
  puts("Supported archive types:");
  puVar8 = (undefined8 *)*plVar7;
  if (puVar8 == (undefined8 *)0x0) {
    puts(" * Apparently, NONE!");
  }
  else {
    while (puVar8 != (undefined8 *)0x0) {
      printf(" * %s: %s\n    Written by %s.\n    %s\n",*puVar8,puVar8[1],puVar8[2],puVar8[3]);
      pcVar15 = "Supports";
      if (*(int *)(*plVar7 + 0x20) == 0) {
        pcVar15 = "Does not support";
      }
      printf("    %s symbolic links.\n",pcVar15);
      puVar8 = (undefined8 *)plVar7[1];
      plVar7 = plVar7 + 1;
    }
  }
  putchar(10);
  pcVar15 = (char *)PHYSFS_getUserDir();
  strcpy(envr,pcVar15);
  sVar9 = strlen(envr);
  builtin_strncpy(envr + sVar9,".testphys_history",0x12);
  iVar5 = access(envr,0);
  if (iVar5 == 0) {
    __stream = fopen(envr,"r");
    if (__stream != (FILE *)0x0) {
      do {
        pcVar15 = fgets((char *)local_238,0x200,__stream);
        if (pcVar15 == (char *)0x0) break;
        sVar9 = strlen((char *)local_238);
        if (local_238[sVar9 - 1] == 10) {
          envr[sVar9 + 0xff] = '\0';
        }
        add_history(local_238);
        iVar5 = feof(__stream);
      } while (iVar5 == 0);
      fclose(__stream);
      goto LAB_0010375b;
    }
    pcVar15 = 
    "\n\nCould not open history file [%s] for reading!\n  Will not have past history available.\n\n"
    ;
  }
  else {
LAB_0010375b:
    history_file = (FILE *)fopen(envr,"ab");
    if ((FILE *)history_file != (FILE *)0x0) goto LAB_00103790;
    pcVar15 = 
    "\n\nCould not open history file [%s] for appending!\n  Will not be able to record this session\'s history.\n\n"
    ;
  }
  printf(pcVar15);
LAB_00103790:
  puts("Enter commands. Enter \"help\" for instructions.");
  fflush(_stdout);
LAB_001037ab:
  __s = (byte *)readline("> ");
  if (__s != (byte *)0x0) {
    sVar9 = strlen((char *)__s);
    __s_00 = (byte *)malloc(sVar9 + 1);
    if (__s_00 == (byte *)0x0) {
      puts("\n\n\nOUT OF MEMORY!\n\n");
      goto LAB_00103961;
    }
    bVar3 = false;
    pbVar13 = __s_00;
    pbVar11 = __s;
    iVar5 = 0;
LAB_001037ed:
    pbVar10 = pbVar11 + 1;
    bVar1 = *pbVar11;
    pbVar11 = pbVar10;
    if (bVar1 == 0x20) goto LAB_0010380d;
    iVar6 = 0;
    if (bVar1 != 0) goto LAB_00103800;
    *pbVar13 = 0;
    pcVar15 = strchr((char *)__s_00,0x20);
    if (pcVar15 == (char *)0x0) {
      pcVar15 = (char *)0x0;
    }
    else {
      *pcVar15 = '\0';
      pcVar15 = pcVar15 + 1;
    }
    iVar5 = iVar4;
    if (*__s_00 != 0) {
      for (cmdinfo = commands; cmdinfo->cmd != (char *)0x0; cmdinfo = cmdinfo + 1) {
        iVar6 = strcmp(cmdinfo->cmd,(char *)__s_00);
        if (iVar6 == 0) {
          if (cmdinfo->argcount < 0) goto LAB_001038dd;
          iVar6 = 0;
          if (pcVar15 == (char *)0x0) goto LAB_001038d9;
          bVar3 = false;
          pcVar14 = pcVar15;
          goto LAB_001038a3;
        }
      }
      puts("Unknown command. Enter \"help\" for instructions.");
      goto LAB_001038f8;
    }
    goto LAB_00103929;
  }
  putchar(10);
LAB_00103961:
  fflush(_stdout);
  free(__s);
  goto LAB_00103971;
LAB_0010380d:
  if (((*pbVar10 & 0xdf) != 0) && (iVar6 = iVar4, iVar5 == 0 && bVar3)) {
LAB_00103800:
    *pbVar13 = bVar1;
    pbVar13 = pbVar13 + 1;
    bVar3 = true;
    iVar5 = iVar6;
  }
  goto LAB_001037ed;
LAB_001038a3:
  cVar2 = *pcVar14;
  if (cVar2 == '\"') {
    bVar3 = !bVar3;
  }
  else {
    if (cVar2 == '\0') goto LAB_001038d7;
    iVar6 = iVar6 + (uint)(!bVar3 && cVar2 == ' ');
  }
  pcVar14 = pcVar14 + 1;
  goto LAB_001038a3;
LAB_001038d7:
  iVar6 = iVar6 + 1;
LAB_001038d9:
  if (iVar6 == cmdinfo->argcount) {
LAB_001038dd:
    iVar5 = (*cmdinfo->func)(pcVar15);
  }
  else {
    output_usage("usage:",cmdinfo);
  }
LAB_001038f8:
  add_history(__s);
  if (history_file != (FILE *)0x0) {
    fprintf((FILE *)history_file,"%s\n",__s);
    fflush((FILE *)history_file);
  }
LAB_00103929:
  free(__s_00);
  fflush(_stdout);
  free(__s);
  if (iVar5 == 0) {
LAB_00103971:
    iVar4 = PHYSFS_deinit();
    if (iVar4 == 0) {
      uVar12 = PHYSFS_getLastError();
      printf("PHYSFS_deinit() failed!\n  reason: %s.\n",uVar12);
    }
    if (history_file != (FILE *)0x0) {
      fclose((FILE *)history_file);
    }
    return 0;
  }
  goto LAB_001037ab;
}

Assistant:

int main(int argc, char **argv)
{
    char *buf = NULL;
    int rc = 0;

#if (defined __MWERKS__)
    extern tSIOUXSettings SIOUXSettings;
    SIOUXSettings.asktosaveonclose = 0;
    SIOUXSettings.autocloseonquit = 1;
    SIOUXSettings.rows = 40;
    SIOUXSettings.columns = 120;
#endif

    printf("\n");

    if (!PHYSFS_init(argv[0]))
    {
        printf("PHYSFS_init() failed!\n  reason: %s.\n", PHYSFS_getLastError());
        return 1;
    } /* if */

    output_versions();
    output_archivers();

    open_history_file();

    printf("Enter commands. Enter \"help\" for instructions.\n");
    fflush(stdout);

    do
    {
#if (defined PHYSFS_HAVE_READLINE)
        buf = readline("> ");
#else
        int i;
        buf = (char *) malloc(512);
        memset(buf, '\0', 512);
        printf("> ");
        fflush(stdout);
        for (i = 0; i < 511; i++)
        {
            int ch = fgetc(stdin);
            if (ch == EOF)
            {
                strcpy(buf, "quit");
                break;
            } /* if */
            else if ((ch == '\n') || (ch == '\r'))
            {
                buf[i] = '\0';
                break;
            } /* else if */
            else if (ch == '\b')
            {
                if (i > 0)
                    i--;
            } /* else if */
            else
            {
                buf[i] = (char) ch;
            } /* else */
        } /* for */
#endif

        rc = process_command(buf);
        fflush(stdout);
        if (buf != NULL)
            free(buf);
    } while (rc);

    if (!PHYSFS_deinit())
        printf("PHYSFS_deinit() failed!\n  reason: %s.\n", PHYSFS_getLastError());

    if (history_file)
        fclose(history_file);

/*
    printf("\n\ntest_physfs written by ryan c. gordon.\n");
    printf(" it makes you shoot teh railgun bettar.\n");
*/

    return 0;
}